

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseLambdaCall(Parser *this,bool lParenSkipped)

{
  _Variadic_union<double> _Var1;
  _Variadic_union<double> _Var2;
  undefined8 uVar3;
  _Variadic_union<double> _Var4;
  Mark *pMVar5;
  istream *piVar6;
  istream *piVar7;
  Token *pTVar8;
  int in_EDX;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Tokenizer *this_00;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> lambda;
  _Variadic_union<double> local_a8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_a0;
  byte local_80;
  Mark local_78;
  _Variadic_union<double> local_70;
  _Variadic_union<double> local_68;
  _Variadic_union<double> local_60;
  istream *local_58;
  _Variadic_union<double> local_50;
  _Variadic_union<double> local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  
  this_00 = (Tokenizer *)CONCAT71(in_register_00000031,lParenSkipped);
  pMVar5 = Stream::getMark((Stream *)this_00);
  _local_38 = *pMVar5;
  if (in_EDX == 0) {
    _Var1 = (_Variadic_union<double>)((long)local_a0._M_first._M_storage._M_storage + 8);
    local_a8 = _Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Expected open parenthesis!","");
    expectToken((Parser *)this_00,LParen,(string *)&local_a8._M_first);
    if (local_a8 != _Var1) {
      operator_delete((void *)local_a8,local_a0._8_8_ + 1);
    }
  }
  parseLambda((Parser *)&local_58);
  _Var1 = (_Variadic_union<double>)((long)local_a0._M_first._M_storage._M_storage + 8);
  local_a8 = _Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Expected closing parenthesis!","");
  expectToken((Parser *)this_00,RParen,(string *)&local_a8._M_first);
  if (local_a8 != _Var1) {
    operator_delete((void *)local_a8,local_a0._8_8_ + 1);
  }
  parseCallArgumentList_abi_cxx11_
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)&local_70._M_first,(Parser *)this_00);
  piVar6 = (istream *)operator_new(0x30);
  piVar7 = local_58;
  _Var1 = local_60;
  local_58 = (istream *)0x0;
  local_a8 = local_70;
  local_a0._M_rest = local_68;
  local_a0._8_8_ = local_60;
  _Var2 = (_Variadic_union<double>)&local_a8;
  uVar3 = &local_a8;
  if (local_70 != (_Variadic_union<double>)&local_70) {
    *(_Variadic_union<double> **)local_68 = &local_a8;
    *(_Variadic_union<double> **)((long)local_70 + 8) = &local_a8;
    local_60 = (_Variadic_union<double>)0x0;
    _Var2 = local_a8;
    uVar3 = local_a0._M_rest;
    local_70 = (_Variadic_union<double>)&local_70;
    local_68 = (_Variadic_union<double>)&local_70;
  }
  local_a0._M_rest = (_Variadic_union<double>)uVar3;
  local_a8 = _Var2;
  *(undefined8 *)(piVar6 + 8) = 1;
  *(undefined ***)piVar6 = &PTR__LambdaCallNode_00157b20;
  *(istream **)(piVar6 + 0x10) = piVar7;
  piVar7 = piVar6 + 0x18;
  *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar6 + 0x18))->_M_rest = local_a8;
  *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar6 + 0x20))->_M_rest =
       local_a0._M_rest;
  *(_Variadic_union<double> *)(piVar6 + 0x28) = _Var1;
  if (local_a8 == (_Variadic_union<double>)&local_a8) {
    *(istream **)(piVar6 + 0x20) = piVar7;
    *(istream **)(piVar6 + 0x18) = piVar7;
  }
  else {
    *(istream **)local_a0._M_rest = piVar7;
    *(istream **)(*(long *)piVar7 + 8) = piVar7;
    local_a0._8_8_ = (_Variadic_union<double>)0x0;
    local_a8 = (_Variadic_union<double>)&local_a8;
    local_a0._M_rest = (_Variadic_union<double>)&local_a8;
  }
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)&local_a8._M_first);
  (this->tokenizer_).stream_.is_ = piVar6;
  pTVar8 = Tokenizer::peek(this_00);
  local_a8._0_4_ = pTVar8->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&local_a0._M_first,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar8->value);
  local_78 = pTVar8->mark;
  if (local_a8._0_4_ == 0x29) {
    do {
      parseCallArgumentList_abi_cxx11_
                ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first,(Parser *)this_00);
      std::__cxx11::
      list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
      _M_move_assign((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                      *)&local_70,&local_50);
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first);
      piVar7 = (this->tokenizer_).stream_.is_;
      (this->tokenizer_).stream_.is_ = (istream *)0x0;
      piVar6 = (istream *)operator_new(0x30);
      _Var1 = local_60;
      local_50 = local_70;
      local_48 = local_68;
      local_40 = local_60;
      _Var2 = (_Variadic_union<double>)&local_50;
      _Var4 = (_Variadic_union<double>)&local_50;
      if (local_70 != (_Variadic_union<double>)&local_70) {
        *(_Variadic_union<double> **)local_68 = &local_50;
        *(_Variadic_union<double> **)&((_Variadic_union<double> *)((long)local_50 + 8))->_M_rest =
             &local_50;
        local_60 = (_Variadic_union<double>)0x0;
        local_70 = (_Variadic_union<double>)&local_70;
        local_68 = (_Variadic_union<double>)&local_70;
        _Var2 = local_50;
        _Var4 = local_48;
      }
      local_48 = _Var4;
      local_50 = _Var2;
      *(undefined8 *)(piVar6 + 8) = 1;
      *(undefined ***)piVar6 = &PTR__FunctionResultCallNode_001578b0;
      *(istream **)(piVar6 + 0x10) = piVar7;
      piVar7 = piVar6 + 0x18;
      *(_Variadic_union<double> *)(piVar6 + 0x18) = local_50;
      *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar6 + 0x20))->_M_rest = local_48;
      *(_Variadic_union<double> *)(piVar6 + 0x28) = _Var1;
      if (local_50 == (_Variadic_union<double>)&local_50) {
        *(istream **)(piVar6 + 0x20) = piVar7;
        *(istream **)(piVar6 + 0x18) = piVar7;
      }
      else {
        *(istream **)local_48 = piVar7;
        *(istream **)(*(long *)piVar7 + 8) = piVar7;
        local_40 = (_Variadic_union<double>)0x0;
        local_50 = (_Variadic_union<double>)&local_50;
        local_48 = (_Variadic_union<double>)&local_50;
      }
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first);
      (this->tokenizer_).stream_.is_ = piVar6;
      pTVar8 = Tokenizer::peek(this_00);
      local_a8._0_4_ = pTVar8->type;
      local_50 = (_Variadic_union<double>)&local_a0;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(pTVar8->value).
                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double> + 0x20)].
        _M_data)((anon_class_8_1_8991fb9c_conflict *)&local_50,&pTVar8->value);
      local_78 = pTVar8->mark;
    } while (local_a8._0_4_ == 0x29);
  }
  piVar7 = (this->tokenizer_).stream_.is_;
  *(undefined4 *)(piVar7 + 8) = local_38;
  *(undefined4 *)(piVar7 + 0xc) = uStack_34;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_80]._M_data)
            ((anon_class_1_0_00000001 *)&local_50,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&local_a0._M_first);
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)&local_70._M_first);
  if (local_58 != (istream *)0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseLambdaCall(bool lParenSkipped)
{
  const auto mark = tokenizer_.getMark();
  if(!lParenSkipped)
    expectToken(TokenType::LParen, "Expected open parenthesis!");
  
  auto lambda = parseLambda();
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<LambdaCallNode>(std::move(lambda), std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }
  node->setMark(mark);
  return node;
}